

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  FILE *in_RSI;
  long *in_RDI;
  sunindextype finish;
  sunindextype start;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_48;
  long local_40;
  long local_28;
  long local_20;
  
  fprintf(in_RSI,"\n");
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    if (local_20 - *(long *)(*in_RDI + 0x20) < 0) {
      local_40 = 0;
    }
    else {
      local_40 = local_20 - *(long *)(*in_RDI + 0x20);
    }
    if (*(long *)(*in_RDI + 8) + -1 < local_20 + *(long *)(*in_RDI + 0x18)) {
      local_48 = *(long *)(*in_RDI + 8) + -1;
    }
    else {
      local_48 = local_20 + *(long *)(*in_RDI + 0x18);
    }
    for (local_28 = 0; local_28 < local_40; local_28 = local_28 + 1) {
      fprintf(in_RSI,"%12s  ","");
    }
    for (local_28 = local_40; local_28 <= local_48; local_28 = local_28 + 1) {
      fprintf(in_RSI,"%12g  ",
              *(undefined8 *)
               (*(long *)(*(long *)(*in_RDI + 0x40) + local_28 * 8) +
               ((local_20 - local_28) + *(long *)(*in_RDI + 0x28)) * 8));
    }
    fprintf(in_RSI,"\n");
  }
  fprintf(in_RSI,"\n");
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, start, finish;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_B(A); i++)
  {
    start  = SUNMAX(0, i - SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A) - 1, i + SM_UBAND_B(A));
    for (j = 0; j < start; j++) { fprintf(outfile, "%12s  ", ""); }
    for (j = start; j <= finish; j++)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      fprintf(outfile, "%12Lg  ", SM_ELEMENT_B(A, i, j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      fprintf(outfile, "%12g  ", SM_ELEMENT_B(A, i, j));
#else
      fprintf(outfile, "%12g  ", SM_ELEMENT_B(A, i, j));
#endif
    }
    fprintf(outfile, "\n");
  }
  fprintf(outfile, "\n");
  return;
}